

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::UncommittedRegionsAccessTestCase::verifyDepthTest
          (UncommittedRegionsAccessTestCase *this,Functions *gl,ShaderProgram *program,GLint width,
          GLint height,GLint widthCommitted)

{
  void **__return_storage_ptr__;
  deUint32 program_00;
  RenderContext *context;
  uint *puVar1;
  VertexArrayBinding *local_1e0;
  int local_180;
  GLint local_17c;
  int y;
  int x;
  GLuint *dataDepthPtr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> dataDepth;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_101;
  string local_100;
  void **local_e0;
  undefined1 local_d8 [8];
  VertexArrayBinding vertexArrays [2];
  GLint widthCommitted_local;
  GLint height_local;
  GLint width_local;
  ShaderProgram *program_local;
  Functions *gl_local;
  UncommittedRegionsAccessTestCase *this_local;
  
  local_e0 = (void **)local_d8;
  vertexArrays[1].pointer.data._4_4_ = widthCommitted;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"vertex",&local_101);
  glu::va::Float((VertexArrayBinding *)local_d8,&local_100,3,4,0,(float *)gl4cts::vertices);
  __return_storage_ptr__ = &vertexArrays[0].pointer.data;
  local_e0 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"inTexCoord",&local_139);
  glu::va::Float((VertexArrayBinding *)__return_storage_ptr__,&local_138,2,4,0,
                 (float *)gl4cts::texCoord);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::operator<<((ostream *)
                  &(this->super_SparseTexture2CommitmentTestCase).
                   super_SparseTextureCommitmentTestCase.field_0x88,"Perform Depth Test - ");
  (*gl->clear)(0x4500);
  (*gl->enable)(0xb71);
  (*gl->depthFunc)(0x201);
  context = deqp::Context::getRenderContext
                      ((this->super_SparseTexture2CommitmentTestCase).
                       super_SparseTextureCommitmentTestCase.super_TestCase.m_context);
  program_00 = glu::ShaderProgram::getProgram(program);
  glu::pr::TriangleStrip
            ((PrimitiveList *)
             &dataDepth.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,6,(deUint32 *)gl4cts::indices);
  glu::draw(context,program_00,2,(VertexArrayBinding *)local_d8,
            (PrimitiveList *)
            &dataDepth.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,(DrawUtilCallback *)0x0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataDepthPtr);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataDepthPtr,
             (long)(width * height));
  puVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataDepthPtr);
  (*gl->readPixels)(0,0,width,height,0x1902,0x1405,puVar1);
  local_17c = vertexArrays[1].pointer.data._4_4_;
  do {
    if (width <= local_17c) {
      (*gl->disable)(0xb71);
      this_local._7_1_ = true;
LAB_01187194:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataDepthPtr);
      local_1e0 = (VertexArrayBinding *)&vertexArrays[1].pointer.data;
      do {
        local_1e0 = local_1e0 + -1;
        glu::VertexArrayBinding::~VertexArrayBinding(local_1e0);
      } while (local_1e0 != (VertexArrayBinding *)local_d8);
      return this_local._7_1_;
    }
    for (local_180 = 0; local_180 < height; local_180 = local_180 + 1) {
      if (puVar1[local_17c + local_180 * width] != 0xffffffff) {
        (*gl->disable)(0xb71);
        this_local._7_1_ = false;
        goto LAB_01187194;
      }
    }
    local_17c = local_17c + 1;
  } while( true );
}

Assistant:

bool UncommittedRegionsAccessTestCase::verifyDepthTest(const Functions& gl, ShaderProgram& program, GLint width,
													   GLint height, GLint widthCommitted)
{
	glu::VertexArrayBinding vertexArrays[] = { glu::va::Float("vertex", 3, 4, 0, vertices),
											   glu::va::Float("inTexCoord", 2, 4, 0, texCoord) };

	mLog << "Perform Depth Test - ";

	gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
	gl.enable(GL_DEPTH_TEST);
	gl.depthFunc(GL_LESS);

	glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays,
			  glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(indices), indices));

	std::vector<GLuint> dataDepth;
	dataDepth.resize(width * height);
	GLuint* dataDepthPtr = dataDepth.data();

	gl.readPixels(0, 0, width, height, GL_DEPTH_COMPONENT, GL_UNSIGNED_INT, (GLvoid*)dataDepthPtr);
	for (int x = widthCommitted; x < width; ++x)
		for (int y = 0; y < height; ++y)
		{
			if (dataDepthPtr[x + y * width] != 0xFFFFFFFF)
			{
				gl.disable(GL_DEPTH_TEST);
				return false;
			}
		}

	gl.disable(GL_DEPTH_TEST);
	return true;
}